

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devextra.c
# Opt level: O3

void do_listoffer(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  MYSQL_RES *pMVar5;
  long lVar6;
  MYSQL *pMVar7;
  tm *__tp;
  char *pcVar8;
  undefined8 uVar9;
  ulong uVar10;
  char *pcVar11;
  basic_string_view<char> fmt;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args;
  string buffer;
  long ttime;
  undefined8 local_4b48 [2];
  char *local_4b38;
  buffer<char> local_4b20;
  char local_4b00 [504];
  char result [200];
  char buf [4608];
  char query [4608];
  char arg2 [4608];
  char arg1 [4608];
  
  bVar1 = str_cmp(argument,"auto");
  pcVar11 = "";
  pcVar8 = "AND status = 0";
  if (bVar1) {
    pcVar8 = "";
  }
  sprintf(query,"SELECT * FROM offerings WHERE deity = \"%s\" %s ORDER BY time ASC",ch->true_name,
          pcVar8);
  pMVar5 = one_query_res(query);
  if (bVar1) {
    pcVar8 = strstr(argument,"accept");
    if ((pcVar8 == (char *)0x0) && (pcVar8 = strstr(argument,"reject"), pcVar8 == (char *)0x0)) {
      bVar1 = is_number(argument);
      if (bVar1) {
        uVar3 = atoi(argument);
        iVar4 = 1;
        do {
          lVar6 = mysql_fetch_row(pMVar5);
          if (lVar6 == 0) {
            mysql_free_result(pMVar5);
            pcVar8 = "You have no offerings by that number.\n\r";
            goto LAB_002d08a4;
          }
          bVar1 = iVar4 < (int)uVar3;
          iVar4 = iVar4 + 1;
        } while (bVar1 || (int)uVar3 < 1);
        iVar4 = atoi(*(char **)(lVar6 + 0x20));
        ttime = atol(*(char **)(lVar6 + 0x28));
        __tp = localtime(&ttime);
        strftime(result,200,"%a %b %d, %l:%M%P",__tp);
        if (iVar4 == 0) {
          pcVar11 = "New";
        }
        else if (iVar4 == 1) {
          pcVar11 = "Rejected";
        }
        else if (iVar4 == 2) {
          pcVar11 = "Approved";
        }
        pcVar8 = buf;
        sprintf(pcVar8,
                "Offering %d:\n\rFrom: %s\n\rTime: %s\n\rStatus: %s\n\rOffering is %s (Vnum %s)\n\r"
                ,(ulong)uVar3,*(undefined8 *)(lVar6 + 0x18),result,pcVar11,
                *(undefined8 *)(lVar6 + 0x10),*(undefined8 *)(lVar6 + 8));
      }
      else {
        send_to_char("Offering listing:\n\r",ch);
        lVar6 = mysql_fetch_row(pMVar5);
        if (lVar6 == 0) {
          send_to_char("There are currently no offerings to you.\n\r",ch);
        }
        else {
          uVar10 = 1;
          do {
            iVar4 = atoi(*(char **)(lVar6 + 0x20));
            if (iVar4 == 0) {
              uVar9 = 0x4e;
            }
            else if (iVar4 == 1) {
              uVar9 = 0x52;
            }
            else {
              uVar9 = 0x20;
              if (iVar4 == 2) {
                uVar9 = 0x41;
              }
            }
            sprintf(buf,"[%3i%c]  %s offered %s\n\r",uVar10,uVar9,*(undefined8 *)(lVar6 + 0x18),
                    *(undefined8 *)(lVar6 + 0x10));
            send_to_char(buf,ch);
            lVar6 = mysql_fetch_row(pMVar5);
            uVar10 = (ulong)((int)uVar10 + 1);
          } while (lVar6 != 0);
        }
        pcVar8 = 
        "Use listoffer <number> to view an offering, and listoffer accept/reject <number> to accept it or not.\n\r"
        ;
      }
      send_to_char(pcVar8,ch);
    }
    else {
      pcVar8 = one_argument(argument,arg1);
      one_argument(pcVar8,arg2);
      iVar2 = atoi(arg2);
      iVar4 = 1;
      do {
        lVar6 = mysql_fetch_row(pMVar5);
        if (lVar6 == 0) {
          send_to_char("That offering wasn\'t found.\n\r",ch);
          goto LAB_002d08bd;
        }
        bVar1 = iVar4 < iVar2;
        iVar4 = iVar4 + 1;
      } while (bVar1 || iVar2 < 1);
      bVar1 = str_cmp(arg1,"reject");
      sprintf(query,"UPDATE offerings SET status=%i WHERE time=%s AND player=\'%s\'",
              (ulong)(bVar1 + 1),*(undefined8 *)(lVar6 + 0x28),*(undefined8 *)(lVar6 + 0x18));
      pMVar7 = open_conn();
      mysql_query(pMVar7,query);
      mysql_close(pMVar7);
      local_4b48[0] = *(undefined8 *)(lVar6 + 0x18);
      local_4b20.size_ = 0;
      local_4b20._vptr_buffer = (_func_int **)&PTR_grow_0044b3a0;
      local_4b20.capacity_ = 500;
      fmt.size_ = 0x1e;
      fmt.data_ = "{}\'s offering has been {}ed.\n\r";
      args.field_1.values_ =
           (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_4b48;
      args.desc_ = 0xcc;
      local_4b38 = arg1;
      local_4b20.ptr_ = local_4b00;
      ::fmt::v9::detail::vformat_to<char>(&local_4b20,fmt,args,(locale_ref)0x0);
      buffer._M_dataplus._M_p = (pointer)&buffer.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&buffer,local_4b20.ptr_,local_4b20.ptr_ + local_4b20.size_);
      if (local_4b20.ptr_ != local_4b00) {
        operator_delete(local_4b20.ptr_,local_4b20.capacity_);
      }
      send_to_char(buffer._M_dataplus._M_p,ch);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)buffer._M_dataplus._M_p != &buffer.field_2) {
        operator_delete(buffer._M_dataplus._M_p,buffer.field_2._M_allocated_capacity + 1);
      }
    }
LAB_002d08bd:
    mysql_free_result(pMVar5);
  }
  else {
    lVar6 = mysql_num_rows(pMVar5);
    mysql_free_result(pMVar5);
    if (lVar6 != 0) {
      pcVar8 = "You have unviewed offerings in your shrine.\n\r";
LAB_002d08a4:
      send_to_char(pcVar8,ch);
    }
  }
  return;
}

Assistant:

void do_listoffer(CHAR_DATA *ch, char *argument)
{
	MYSQL_RES *res_set;
	MYSQL_ROW row;
	char query[MSL], buf[MSL], result[200], arg1[MSL], arg2[MSL];
	bool autol= false, found= false;
	int status, i = 1, argnum;
	long ttime;

	if (!str_cmp(argument, "auto"))
		autol = true;

	sprintf(query, "SELECT * FROM offerings WHERE deity = \"%s\" %s ORDER BY time ASC",
		ch->true_name,
		autol ? "AND status = 0" : "");

	res_set = one_query_res(query);

	if (autol && !mysql_num_rows(res_set))
	{
		mysql_free_result(res_set);
		return;
	}
	else if (autol)
	{
		mysql_free_result(res_set);
		
		send_to_char("You have unviewed offerings in your shrine.\n\r", ch);		
		return;
	}

	if (strstr(argument, "accept") || strstr(argument, "reject"))
	{
		argument = one_argument(argument, arg1);
		argument = one_argument(argument, arg2);
		argnum = atoi(arg2);

		while ((row = mysql_fetch_row(res_set)))
		{
			if (i++ < argnum || argnum < 1)
				continue;

			if (!str_cmp(arg1, "reject"))
				status = 1;
			else
				status = 2;

			sprintf(query, "UPDATE offerings SET status=%i WHERE time=%s AND player='%s'", status, row[5], row[3]);
			one_query(query);

			auto buffer = fmt::format("{}'s offering has been {}ed.\n\r", row[3], arg1); //TODO: change the rest of the sprintf calls to format
			send_to_char(buffer.c_str(), ch);

			found = true;
			break;
		}

		if (!found)
			send_to_char("That offering wasn't found.\n\r", ch);

		mysql_free_result(res_set);
		return;
	}

	if (is_number(argument))
	{
		argnum = atoi(argument);
		while ((row = mysql_fetch_row(res_set)))
		{
			if (i++ < argnum || argnum < 1)
				continue;

			status = atoi(row[4]);
			ttime = atol(row[5]);

			strftime(result, 200, "%a %b %d, %l:%M%P", localtime(&ttime));
			sprintf(buf, "Offering %d:\n\rFrom: %s\n\rTime: %s\n\rStatus: %s\n\rOffering is %s (Vnum %s)\n\r",
				argnum,
				row[3],
				result,
				status == 0 ? "New" : status == 1 ? "Rejected" : status == 2 ? "Approved" : "",
				row[2],
				row[1]);
			send_to_char(buf, ch);

			found = true;
			break;
		}

		mysql_free_result(res_set);

		if (!found)
			send_to_char("You have no offerings by that number.\n\r", ch);

		return;
	}

	send_to_char("Offering listing:\n\r", ch);

	while ((row = mysql_fetch_row(res_set)))
	{
		status = atoi(row[4]);
		sprintf(buf, "[%3i%c]  %s offered %s\n\r", i++, status == 0 ? 'N' : status == 1 ? 'R' : status == 2 ? 'A' : ' ', row[3], row[2]);
		send_to_char(buf, ch);
		found = true;
	}

	if (!found)
		send_to_char("There are currently no offerings to you.\n\r", ch);

	send_to_char("Use listoffer <number> to view an offering, and listoffer accept/reject <number> to accept it or not.\n\r", ch);
	mysql_free_result(res_set);
}